

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifr.c
# Opt level: O0

int igsc_ecc_config_get(igsc_device_handle *handle,uint8_t *cur_ecc_state,uint8_t *pen_ecc_state)

{
  long lVar1;
  igsc_lib_ctx *lib_ctx_00;
  uint8_t *__s;
  mkhi_msg_hdr *resp_header;
  size_t buf_size;
  uint uVar2;
  igsc_log_func_t p_Var3;
  char *pcVar4;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffff5c8;
  undefined4 uVar5;
  igsc_log_func_t igsc_log_func_10;
  igsc_log_func_t igsc_log_func_9;
  igsc_log_func_t igsc_log_func_8;
  igsc_log_func_t igsc_log_func_7;
  igsc_log_func_t igsc_log_func_6;
  igsc_log_func_t igsc_log_func_5;
  igsc_log_func_t igsc_log_func_4;
  igsc_log_func_t igsc_log_func_3;
  igsc_log_func_t igsc_log_func_2;
  igsc_log_func_t igsc_log_func_1;
  igsc_log_func_t igsc_log_func;
  gfsp_get_ecc_config_res *resp;
  gfsp_get_ecc_config_req *req;
  igsc_lib_ctx *lib_ctx;
  size_t buf_len;
  size_t response_len;
  size_t request_len;
  int status;
  uint8_t *pen_ecc_state_local;
  uint8_t *cur_ecc_state_local;
  igsc_device_handle *handle_local;
  size_t local_920;
  size_t received_len;
  char __time_buf_17 [128];
  char __time_buf_16 [128];
  char __time_buf_15 [128];
  char __time_buf_14 [128];
  char __time_buf_13 [128];
  char __time_buf_12 [128];
  char __time_buf_11 [128];
  char __time_buf_10 [128];
  char __time_buf_9 [128];
  char __time_buf_8 [128];
  char __time_buf_7 [128];
  char __time_buf_6 [128];
  char __time_buf_5 [128];
  char __time_buf_4 [128];
  char __time_buf_3 [128];
  char __time_buf_2 [128];
  char __time_buf_1 [128];
  char __time_buf [128];
  
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffff5c8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_920 = 0;
  if ((((handle == (igsc_device_handle *)0x0) || (handle->ctx == (igsc_lib_ctx *)0x0)) ||
      (cur_ecc_state == (uint8_t *)0x0)) || (pen_ecc_state == (uint8_t *)0x0)) {
    handle_local._4_4_ = 3;
  }
  else {
    lib_ctx_00 = handle->ctx;
    uVar2 = igsc_get_log_level();
    if (uVar2 != 0) {
      p_Var3 = igsc_get_log_callback_func();
      if (p_Var3 == (igsc_log_func_t)0x0) {
        pcVar4 = gsc_time(__time_buf_1 + 0x78,0x80);
        syslog(7,"%s: IGSC: (%s:%s():%d) in get ecc config, initializing driver\n",pcVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
               "igsc_ecc_config_get",0x627);
      }
      else {
        p_Var3 = igsc_get_log_callback_func();
        pcVar4 = gsc_time(__time_buf_1 + 0x78,0x80);
        (*p_Var3)(IGSC_LOG_LEVEL_DEBUG,
                  "%s: IGSC: (%s:%s():%d) in get ecc config, initializing driver\n",pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                  "igsc_ecc_config_get",0x627);
      }
    }
    handle_local._4_4_ = gsc_driver_init(lib_ctx_00,&GUID_METEE_MKHI);
    if (handle_local._4_4_ == 0) {
      __s = lib_ctx_00->working_buffer;
      resp_header = (mkhi_msg_hdr *)lib_ctx_00->working_buffer;
      buf_size = lib_ctx_00->working_buffer_length;
      uVar2 = igsc_get_log_level();
      if (uVar2 != 0) {
        p_Var3 = igsc_get_log_callback_func();
        if (p_Var3 == (igsc_log_func_t)0x0) {
          pcVar4 = gsc_time(__time_buf_4 + 0x78,0x80);
          syslog(7,"%s: IGSC: (%s:%s():%d) validating buffer\n",pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                 "igsc_ecc_config_get",0x637);
        }
        else {
          p_Var3 = igsc_get_log_callback_func();
          pcVar4 = gsc_time(__time_buf_4 + 0x78,0x80);
          (*p_Var3)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) validating buffer\n",pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                    "igsc_ecc_config_get",0x637);
        }
      }
      request_len._4_4_ = gsc_fwu_buffer_validate(lib_ctx_00,8,0xc);
      if (request_len._4_4_ == 0) {
        memset(__s,0,8);
        *__s = '1';
        __s[1] = __s[1] & 0x80;
        __s[4] = '\t';
        __s[5] = '\0';
        __s[6] = '\0';
        __s[7] = '\0';
        uVar2 = igsc_get_log_level();
        if (uVar2 != 0) {
          p_Var3 = igsc_get_log_callback_func();
          if (p_Var3 == (igsc_log_func_t)0x0) {
            pcVar4 = gsc_time(__time_buf_7 + 0x78,0x80);
            syslog(7,"%s: IGSC: (%s:%s():%d) sending command\n",pcVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                   "igsc_ecc_config_get",0x645);
          }
          else {
            p_Var3 = igsc_get_log_callback_func();
            pcVar4 = gsc_time(__time_buf_7 + 0x78,0x80);
            (*p_Var3)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) sending command\n",pcVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                      "igsc_ecc_config_get",0x645);
          }
        }
        request_len._4_4_ = gsc_tee_command(lib_ctx_00,__s,8,resp_header,buf_size,&local_920);
        if (request_len._4_4_ == 0) {
          if (local_920 < 4) {
            p_Var3 = igsc_get_log_callback_func();
            if (p_Var3 == (igsc_log_func_t)0x0) {
              pcVar4 = gsc_time(__time_buf_10 + 0x78,0x80);
              syslog(3,"%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",pcVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                     "igsc_ecc_config_get",0x650,local_920);
            }
            else {
              p_Var3 = igsc_get_log_callback_func();
              pcVar4 = gsc_time(__time_buf_11 + 0x78,0x80);
              (*p_Var3)(IGSC_LOG_LEVEL_ERROR,
                        "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",pcVar4,
                        "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                        "igsc_ecc_config_get",0x650,local_920);
            }
            request_len._4_4_ = 6;
          }
          else {
            request_len._4_4_ =
                 gfsp_heci_validate_response_header
                           (lib_ctx_00,resp_header,(uint32_t)resp_header[1],9);
            if (request_len._4_4_ == 0) {
              if (resp_header->result == '\0') {
                if (local_920 < 0xc) {
                  p_Var3 = igsc_get_log_callback_func();
                  if (p_Var3 == (igsc_log_func_t)0x0) {
                    pcVar4 = gsc_time(__time_buf_16 + 0x78,0x80);
                    syslog(3,"%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",pcVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                           ,"igsc_ecc_config_get",0x668,local_920);
                  }
                  else {
                    p_Var3 = igsc_get_log_callback_func();
                    pcVar4 = gsc_time(__time_buf_17 + 0x78,0x80);
                    (*p_Var3)(IGSC_LOG_LEVEL_ERROR,
                              "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",pcVar4,
                              "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                              ,"igsc_ecc_config_get",0x668,local_920);
                  }
                  request_len._4_4_ = 6;
                }
                else {
                  *cur_ecc_state = resp_header[2].group_id;
                  *pen_ecc_state = resp_header[2].field_0x1;
                  uVar2 = igsc_get_log_level();
                  if (uVar2 != 0) {
                    p_Var3 = igsc_get_log_callback_func();
                    if (p_Var3 == (igsc_log_func_t)0x0) {
                      pcVar4 = gsc_time((char *)&received_len,0x80);
                      syslog(7,"%s: IGSC: (%s:%s():%d) Get ECC config success\n",pcVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                             ,"igsc_ecc_config_get",0x670);
                    }
                    else {
                      p_Var3 = igsc_get_log_callback_func();
                      pcVar4 = gsc_time((char *)&received_len,0x80);
                      (*p_Var3)(IGSC_LOG_LEVEL_DEBUG,
                                "%s: IGSC: (%s:%s():%d) Get ECC config success\n",pcVar4,
                                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                ,"igsc_ecc_config_get",0x670);
                    }
                  }
                }
              }
              else {
                p_Var3 = igsc_get_log_callback_func();
                if (p_Var3 == (igsc_log_func_t)0x0) {
                  pcVar4 = gsc_time(__time_buf_14 + 0x78,0x80);
                  syslog(3,"%s: IGSC: (%s:%s():%d) Get ECC config command failed with result 0x%x\n"
                         ,pcVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                         "igsc_ecc_config_get",0x661,CONCAT44(uVar5,(uint)resp_header->result));
                }
                else {
                  p_Var3 = igsc_get_log_callback_func();
                  pcVar4 = gsc_time(__time_buf_15 + 0x78,0x80);
                  (*p_Var3)(IGSC_LOG_LEVEL_ERROR,
                            "%s: IGSC: (%s:%s():%d) Get ECC config command failed with result 0x%x\n"
                            ,pcVar4,
                            "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                            ,"igsc_ecc_config_get",0x661,CONCAT44(uVar5,(uint)resp_header->result));
                }
                request_len._4_4_ = 6;
              }
            }
            else {
              p_Var3 = igsc_get_log_callback_func();
              if (p_Var3 == (igsc_log_func_t)0x0) {
                pcVar4 = gsc_time(__time_buf_12 + 0x78,0x80);
                syslog(3,"%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n",pcVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                       "igsc_ecc_config_get",0x65a,CONCAT44(uVar5,request_len._4_4_));
              }
              else {
                p_Var3 = igsc_get_log_callback_func();
                pcVar4 = gsc_time(__time_buf_13 + 0x78,0x80);
                (*p_Var3)(IGSC_LOG_LEVEL_ERROR,
                          "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n",pcVar4,
                          "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                          ,"igsc_ecc_config_get",0x65a,CONCAT44(uVar5,request_len._4_4_));
              }
            }
          }
        }
        else {
          p_Var3 = igsc_get_log_callback_func();
          if (p_Var3 == (igsc_log_func_t)0x0) {
            pcVar4 = gsc_time(__time_buf_8 + 0x78,0x80);
            syslog(3,"%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n",pcVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                   "igsc_ecc_config_get",0x64a,CONCAT44(uVar5,request_len._4_4_));
          }
          else {
            p_Var3 = igsc_get_log_callback_func();
            pcVar4 = gsc_time(__time_buf_9 + 0x78,0x80);
            (*p_Var3)(IGSC_LOG_LEVEL_ERROR,
                      "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n",pcVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                      "igsc_ecc_config_get",0x64a,CONCAT44(uVar5,request_len._4_4_));
          }
        }
      }
      else {
        p_Var3 = igsc_get_log_callback_func();
        if (p_Var3 == (igsc_log_func_t)0x0) {
          pcVar4 = gsc_time(__time_buf_5 + 0x78,0x80);
          syslog(3,"%s: IGSC: (%s:%s():%d) Internal error - failed to validate buffer %d\n",pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                 "igsc_ecc_config_get",0x63c,CONCAT44(uVar5,request_len._4_4_));
        }
        else {
          p_Var3 = igsc_get_log_callback_func();
          pcVar4 = gsc_time(__time_buf_6 + 0x78,0x80);
          (*p_Var3)(IGSC_LOG_LEVEL_ERROR,
                    "%s: IGSC: (%s:%s():%d) Internal error - failed to validate buffer %d\n",pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                    "igsc_ecc_config_get",0x63c,CONCAT44(uVar5,request_len._4_4_));
        }
      }
      gsc_driver_deinit(lib_ctx_00);
      handle_local._4_4_ = request_len._4_4_;
    }
    else {
      p_Var3 = igsc_get_log_callback_func();
      if (p_Var3 == (igsc_log_func_t)0x0) {
        pcVar4 = gsc_time(__time_buf_2 + 0x78,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n",pcVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
               "igsc_ecc_config_get",0x62c,CONCAT44(uVar5,handle_local._4_4_));
      }
      else {
        p_Var3 = igsc_get_log_callback_func();
        pcVar4 = gsc_time(__time_buf_3 + 0x78,0x80);
        (*p_Var3)(IGSC_LOG_LEVEL_ERROR,
                  "%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n",pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                  "igsc_ecc_config_get",0x62c,CONCAT44(uVar5,handle_local._4_4_));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return handle_local._4_4_;
}

Assistant:

int igsc_ecc_config_get(IN  struct igsc_device_handle *handle,
                        OUT uint8_t *cur_ecc_state,
                        OUT uint8_t *pen_ecc_state)
{
    int status;
    size_t request_len;
    size_t response_len;
    size_t received_len = 0;
    size_t buf_len;
    struct igsc_lib_ctx *lib_ctx;
    struct gfsp_get_ecc_config_req *req;
    struct gfsp_get_ecc_config_res *resp;

    if (!handle || !handle->ctx || !cur_ecc_state || !pen_ecc_state)
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    lib_ctx = handle->ctx;

    gsc_debug("in get ecc config, initializing driver\n");

    status = gsc_driver_init(lib_ctx, &GUID_METEE_MKHI);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Cannot initialize driver, status %d\n", status);
        return status;
    }

    req = (struct gfsp_get_ecc_config_req *)lib_ctx->working_buffer;
    request_len = sizeof(*req);

    resp = (struct gfsp_get_ecc_config_res *)lib_ctx->working_buffer;
    response_len = sizeof(*resp);
    buf_len = lib_ctx->working_buffer_length;

    gsc_debug("validating buffer\n");

    status = gsc_fwu_buffer_validate(lib_ctx, request_len, response_len);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Internal error - failed to validate buffer %d\n", status);
        goto exit;
    }

    memset(req, 0, request_len);
    req->header.group_id = MKHI_GROUP_ID_GFSP;
    req->header.command = 0;
    req->gfsp_heci_header = GFSP_GET_ECC_CFG_CMD;

    gsc_debug("sending command\n");

    status = gsc_tee_command(lib_ctx, req, request_len, resp, buf_len, &received_len);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response %d\n", status);
        goto exit;
    }

    if (received_len < sizeof(resp->header))
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    status = gfsp_heci_validate_response_header(lib_ctx, &resp->header,
                                                resp->gfsp_heci_header,
                                                GFSP_GET_ECC_CFG_CMD);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response %d\n", status);
        goto exit;
    }

    if (resp->header.result != 0)
    {
       gsc_error("Get ECC config command failed with result 0x%x\n",
                 resp->header.result);
       status = IGSC_ERROR_PROTOCOL;
       goto exit;
    }

    if (received_len < response_len)
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    *cur_ecc_state = resp->cur_ecc_state;
    *pen_ecc_state = resp->pen_ecc_state;

    gsc_debug("Get ECC config success\n");

exit:
    gsc_driver_deinit(lib_ctx);

    return status;
}